

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O0

bool markChildEdge(args *t,stateRecord *state,bool which)

{
  __pointer_type p_00;
  bool bVar1;
  node *local_90;
  node *newValue;
  node *oldValue;
  edge helpeeEdge;
  bool result;
  bool p;
  bool d;
  bool i;
  bool n;
  node *temp;
  node *address;
  undefined1 auStack_48 [4];
  Flag flag;
  edge edge;
  node *node;
  bool which_local;
  stateRecord *state_local;
  args *t_local;
  
  bVar1 = state->mode != INJECTION;
  if (bVar1) {
    _auStack_48 = (state->successorRecord).lastEdge.parent;
    edge.parent = (state->successorRecord).lastEdge.child;
    edge.child = *(node **)&(state->successorRecord).lastEdge.which;
  }
  else {
    _auStack_48 = (state->targetEdge).parent;
    edge.parent = (state->targetEdge).child;
    edge.child = *(node **)&(state->targetEdge).which;
  }
  edge._16_8_ = edge.parent;
  do {
    while( true ) {
      p_00 = std::atomic::operator_cast_to_node_((atomic *)(edge._16_8_ + 8 + (ulong)which * 8));
      helpeeEdge._23_1_ = isNull(p_00);
      helpeeEdge._22_1_ = IFlagSet(p_00);
      helpeeEdge._21_1_ = DFlagSet(p_00);
      helpeeEdge._20_1_ = PFlagSet(p_00);
      newValue = getAddress(p_00);
      if ((helpeeEdge._22_1_ & 1) == 0) break;
      fillTheEdge((edge *)&oldValue,(node *)edge._16_8_,newValue,which);
      helpTargetNode(t,(edge *)&oldValue,state->depth + 1);
    }
    if ((helpeeEdge._21_1_ & 1) != 0) {
      if (bVar1) {
        helpTargetNode(t,(edge *)auStack_48,state->depth + 1);
        return false;
      }
      return true;
    }
    if ((helpeeEdge._20_1_ & 1) != 0) {
      if (!bVar1) {
        helpSuccessorNode(t,(edge *)auStack_48,state->depth + 1);
        return false;
      }
      return true;
    }
    if ((helpeeEdge._23_1_ & 1) != 0) {
      newValue = setNull(newValue);
    }
    if (bVar1) {
      local_90 = setPFlag(newValue);
    }
    else {
      local_90 = setDFlag(newValue);
    }
    helpeeEdge._19_1_ = CAS((node *)edge._16_8_,(ulong)which,newValue,local_90);
  } while (!(bool)helpeeEdge._19_1_);
  return true;
}

Assistant:

bool markChildEdge(struct args* t, struct stateRecord* state, bool which)
{
    struct node* node;
    struct edge edge;
    Flag flag;
    struct node* address;
    struct node* temp;
    bool n,i,d,p,result;
    struct edge helpeeEdge;
    struct node* oldValue;
    struct node* newValue;

    if(state->mode == INJECTION)
    {
        edge = state->targetEdge;
        flag = DELETE_FLAG;
    }
    else
    {
        edge = state->successorRecord.lastEdge;
        flag = PROMOTE_FLAG;
    }

    node = edge.child;

    while(true)
    {
        temp = node->child[which];
        n=isNull(temp);
        i=IFlagSet(temp);
        d=DFlagSet(temp);
        p=PFlagSet(temp);
        address=getAddress(temp);
        if(i)
        {
            fillTheEdge(&helpeeEdge,node,address,which);
            helpTargetNode(t,&helpeeEdge,state->depth+1);
            continue;
        }
        else if(d)
        {
            if(flag == PROMOTE_FLAG)
            {
                helpTargetNode(t,&edge,state->depth+1);
                return false;
            }
            else
            {
                return true;
            }
        }
        else if(p)
        {
            if(flag == DELETE_FLAG)
            {
                helpSuccessorNode(t,&edge,state->depth+1);
                return false;
            }
            else
            {
                return true;
            }
        }

        if(n)
        {
            oldValue = setNull(address);
        }
        else
        {
            oldValue = address;
        }

        if(flag == DELETE_FLAG)
        {
            newValue = setDFlag(oldValue);
        }
        else
        {
            newValue = setPFlag(oldValue);
        }
        result = CAS(node,which,oldValue,newValue);
        if(result)
        {
            break;
        }
    }
    return true;
}